

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

int ws_dialer_get(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_getopt(ws_dialer_options,name,arg,buf,szp,t);
  if (iVar1 == 9) {
    iVar1 = nni_http_client_get(*(nni_http_client **)((long)arg + 0x50),name,buf,szp,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
ws_dialer_get(void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	nni_ws_dialer *d = arg;
	int            rv;

	rv = nni_getopt(ws_dialer_options, name, d, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_http_client_get(d->client, name, buf, szp, t);
	}
	return (rv);
}